

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O0

void __thiscall ConstantExpression::set(ConstantExpression *this,float value)

{
  long lVar1;
  string local_1e0 [32];
  string local_1c0 [48];
  long local_190;
  ostringstream builder;
  float value_local;
  ConstantExpression *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190,_S_out);
  std::ios_base::precision((ios_base *)((long)&local_190 + *(long *)(local_190 + -0x18)),8);
  std::ostream::operator<<(&local_190,value);
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::find((char)local_1c0,0x2e);
  std::__cxx11::string::~string(local_1c0);
  if (lVar1 == -1) {
    std::operator<<((ostream *)&local_190,".0");
  }
  this->m_isLiteral = false;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_text,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return;
}

Assistant:

void set( float value )
	{
		std::ostringstream builder(std::ios_base::out);

		builder.precision(8);
		builder << value;

		if (builder.str().find('.') == std::string::npos)
			builder << ".0";

		m_isLiteral = false;
		m_text = builder.str();
	}